

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O1

void __thiscall
TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test::TestBody
          (TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test *this)

{
  int iVar1;
  path *ppVar2;
  long lVar3;
  char *in_R9;
  pointer *__ptr;
  string configFile;
  AssertionResult gtest_ar_;
  path resolvedPath;
  path configPath;
  path resolvedPathCombined;
  path expectedDefaultPath;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  AssertHelper local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  internal local_160 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  string local_150;
  string local_130;
  path local_110 [4];
  path local_70;
  path local_48;
  
  unsetenv("PLUGIN_CONFIG_PATH");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"pluginlist.pb.txt","");
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (local_110,&local_180,auto_format);
  std::filesystem::__cxx11::operator/(local_110 + 3,&local_48,local_110);
  std::filesystem::__cxx11::path::~path(local_110);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  plugin::PluginManager::ResolveConfigPath(local_110 + 2,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::operator/(&local_70,local_110,local_110 + 2);
  std::filesystem::__cxx11::path::~path(local_110);
  std::filesystem::__cxx11::path::path(local_110,local_110 + 2);
  std::filesystem::__cxx11::path::path(local_110 + 1,&local_70);
  iVar1 = std::filesystem::__cxx11::path::compare(local_110);
  ppVar2 = local_110;
  if (iVar1 != 0) {
    iVar1 = std::filesystem::__cxx11::path::compare(local_110 + 1);
    ppVar2 = local_110 + 1;
    if (iVar1 != 0) {
      ppVar2 = local_110 + 2;
    }
  }
  local_160[0] = (internal)(local_110 + 2 != ppVar2);
  local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_160[0]) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,local_160,(AssertionResult *)"IsIn(configPath, expectedPaths)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0xef,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,local_158);
  }
  lVar3 = 0x28;
  do {
    std::filesystem::__cxx11::path::~path
              ((path *)((long)&local_110[0]._M_pathname._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(local_110 + 2);
  std::filesystem::__cxx11::path::~path(local_110 + 3);
  std::filesystem::__cxx11::path::~path(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, FallsbackOnDefault_Config)
{
    unsetenv("PLUGIN_CONFIG_PATH");
    std::string const configFile{"pluginlist.pb.txt"};
    auto const expectedDefaultPath = plugin::detail::GetApplicationPath();
    auto const configPath = expectedDefaultPath / configFile;

    auto const resolvedPath = plugin::PluginManager::ResolveConfigPath(configFile);
    auto const resolvedPathCombined = plugin::detail::GetApplicationPath() / resolvedPath;

    auto const expectedPaths = {resolvedPath, resolvedPathCombined};
    EXPECT_TRUE(IsIn(configPath, expectedPaths));
}